

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp.cpp
# Opt level: O0

ll fastexp(ll a,ll p,ll mod)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined8 local_28;
  ll res;
  ll mod_local;
  ll p_local;
  ll a_local;
  
  lVar2 = a % mod + mod;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(1),8);
  local_28 = SUB168((auVar1 << 0x40 | ZEXT816(1)) % SEXT816(mod),0);
  for (mod_local = p; p_local = lVar2 % mod, mod_local != 0; mod_local = mod_local / 2) {
    if (mod_local % 2 != 0) {
      local_28 = (local_28 * p_local) % mod;
    }
    lVar2 = p_local * p_local;
  }
  return local_28;
}

Assistant:

ll fastexp(ll a, ll p, ll mod) {
	a = ((a % mod) + mod) % mod; /// so many mod's because of corner cases
	ll res = 1 % mod;
	for (; p; a = (a * a) % mod, p /= 2)
		if (p % 2)
			res = (res * a) % mod;
	return res;
}